

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O3

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  int iVar1;
  FILE *__stream;
  SQAllocContext pSVar2;
  SQChar *s;
  size_t size;
  SQRESULT SVar3;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,0);
    iVar1 = fseek(__stream,0,2);
    pSVar2 = sq_getallocctx(v);
    s = (SQChar *)sq_malloc(pSVar2,(long)iVar1);
    fseek(__stream,0,0);
    size = fread(s,1,(long)iVar1,__stream);
    SVar3 = sq_compile(v,s,size,filename,printerror,(HSQOBJECT *)0x0);
    pSVar2 = sq_getallocctx(v);
    sq_free(pSVar2,s,size);
    fclose(__stream);
    return SVar3 >> 0x3f;
  }
  SVar3 = sq_throwerror(v,"cannot open the file");
  return SVar3;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    if(file){
        SQInteger size = 0;
        SQChar *buffer = readFileData(v, file, size);
        SQRESULT r = SQ_ERROR;

        if(SQ_SUCCEEDED(sq_compile(v,buffer,size,filename,printerror))){
            r = SQ_OK;
        }
        sq_free(sq_getallocctx(v), buffer, size);
        sqstd_fclose(file);
        return r;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}